

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O0

void OutputFlatDependencies
               (Configuration *config,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
               *components,path *outfile)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  size_type sVar4;
  string *psVar5;
  undefined8 in_RSI;
  pair<std::_Rb_tree_const_iterator<Component_*>,_bool> pVar6;
  Component **d_1;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
  *__range2_1;
  Component **d;
  iterator __end2;
  iterator __begin2;
  unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
  *__range2;
  set<Component_*,_std::less<Component_*>,_std::allocator<Component_*>_> depcomps;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>
  *c;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
  *__range1;
  ostream *out;
  OstreamHolder outHolder;
  Component *in_stack_fffffffffffffb58;
  ostream *in_stack_fffffffffffffb60;
  Component *in_stack_fffffffffffffb78;
  Component *in_stack_fffffffffffffb80;
  Configuration *in_stack_fffffffffffffb88;
  Component *in_stack_fffffffffffffc18;
  string local_3a8 [32];
  string local_388 [32];
  _Base_ptr local_368;
  undefined1 local_360;
  _Base_ptr local_358;
  undefined1 local_350;
  reference local_348;
  _Node_iterator_base<Component_*,_false> local_340;
  _Node_iterator_base<Component_*,_false> local_338;
  unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
  *local_330;
  string local_328 [32];
  string local_308 [32];
  _Base_ptr local_2e8;
  undefined1 local_2e0;
  _Base_ptr local_2d8;
  undefined1 local_2d0;
  reference local_2c8;
  _Node_iterator_base<Component_*,_false> local_2c0;
  _Node_iterator_base<Component_*,_false> local_2b8;
  unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
  *local_2b0;
  string local_278 [32];
  reference local_258;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_true>
  local_250;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_true>
  local_248;
  undefined8 local_240;
  ostream *local_228;
  OstreamHolder local_220;
  undefined8 local_10;
  
  local_10 = in_RSI;
  OstreamHolder::OstreamHolder
            ((OstreamHolder *)in_stack_fffffffffffffb80,&in_stack_fffffffffffffb78->root);
  local_228 = OstreamHolder::get(&local_220);
  poVar2 = std::operator<<(local_228,"digraph dependencies {");
  std::operator<<(poVar2,'\n');
  local_240 = local_10;
  local_248._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
                *)in_stack_fffffffffffffb58);
  local_250._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
              *)in_stack_fffffffffffffb58);
  while (bVar1 = std::__detail::operator!=(&local_248,&local_250), bVar1) {
    local_258 = std::__detail::
                _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_false,_true>
                ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_false,_true>
                             *)0x1a29fa);
    boost::filesystem::path::string_abi_cxx11_(&local_258->second->root);
    uVar3 = std::__cxx11::string::size();
    if ((2 < uVar3) &&
       (sVar4 = std::
                unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
                ::size((unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
                        *)0x1a2a4c), sVar4 != 0)) {
      poVar2 = std::operator<<(local_228,"  ");
      Component::QuotedName_abi_cxx11_(in_stack_fffffffffffffc18);
      poVar2 = std::operator<<(poVar2,local_278);
      poVar2 = std::operator<<(poVar2," [shape=");
      in_stack_fffffffffffffc18 = (Component *)getShapeForSize(in_stack_fffffffffffffb58);
      poVar2 = std::operator<<(poVar2,(char *)in_stack_fffffffffffffc18);
      std::operator<<(poVar2,"];\n");
      std::__cxx11::string::~string(local_278);
    }
    std::set<Component_*,_std::less<Component_*>,_std::allocator<Component_*>_>::set
              ((set<Component_*,_std::less<Component_*>,_std::allocator<Component_*>_> *)0x1a2b77);
    local_2b0 = &local_258->second->privDeps;
    local_2b8._M_cur =
         (__node_type *)
         std::
         unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
         ::begin((unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
                  *)in_stack_fffffffffffffb58);
    local_2c0._M_cur =
         (__node_type *)
         std::
         unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
         ::end((unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
                *)in_stack_fffffffffffffb58);
    while (bVar1 = std::__detail::operator!=(&local_2b8,&local_2c0), bVar1) {
      local_2c8 = std::__detail::_Node_iterator<Component_*,_true,_false>::operator*
                            ((_Node_iterator<Component_*,_true,_false> *)0x1a2be4);
      boost::filesystem::path::string_abi_cxx11_(&(*local_2c8)->root);
      uVar3 = std::__cxx11::string::size();
      if ((2 < uVar3) &&
         (sVar4 = std::
                  unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
                  ::size((unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
                          *)0x1a2c34), sVar4 != 0)) {
        pVar6 = std::set<Component_*,_std::less<Component_*>,_std::allocator<Component_*>_>::insert
                          ((set<Component_*,_std::less<Component_*>,_std::allocator<Component_*>_> *
                           )in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
        local_2e8 = (_Base_ptr)pVar6.first._M_node;
        local_2e0 = pVar6.second;
        local_2d8 = local_2e8;
        local_2d0 = local_2e0;
        if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          poVar2 = std::operator<<(local_228,"  ");
          Component::QuotedName_abi_cxx11_(in_stack_fffffffffffffc18);
          poVar2 = std::operator<<(poVar2,local_308);
          poVar2 = std::operator<<(poVar2," -> ");
          Component::QuotedName_abi_cxx11_(in_stack_fffffffffffffc18);
          poVar2 = std::operator<<(poVar2,local_328);
          poVar2 = std::operator<<(poVar2," [color=");
          psVar5 = getLinkColor_abi_cxx11_
                             (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                              in_stack_fffffffffffffb78);
          poVar2 = std::operator<<(poVar2,(string *)psVar5);
          poVar2 = std::operator<<(poVar2,"];");
          std::operator<<(poVar2,'\n');
          std::__cxx11::string::~string(local_328);
          std::__cxx11::string::~string(local_308);
        }
      }
      std::__detail::_Node_iterator<Component_*,_true,_false>::operator++
                ((_Node_iterator<Component_*,_true,_false> *)in_stack_fffffffffffffb60);
    }
    local_330 = &local_258->second->pubDeps;
    local_338._M_cur =
         (__node_type *)
         std::
         unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
         ::begin((unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
                  *)in_stack_fffffffffffffb58);
    local_340._M_cur =
         (__node_type *)
         std::
         unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
         ::end((unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
                *)in_stack_fffffffffffffb58);
    while (bVar1 = std::__detail::operator!=(&local_338,&local_340), bVar1) {
      local_348 = std::__detail::_Node_iterator<Component_*,_true,_false>::operator*
                            ((_Node_iterator<Component_*,_true,_false> *)0x1a2ee3);
      boost::filesystem::path::string_abi_cxx11_(&(*local_348)->root);
      uVar3 = std::__cxx11::string::size();
      if ((2 < uVar3) &&
         (sVar4 = std::
                  unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
                  ::size((unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
                          *)0x1a2f2d), sVar4 != 0)) {
        pVar6 = std::set<Component_*,_std::less<Component_*>,_std::allocator<Component_*>_>::insert
                          ((set<Component_*,_std::less<Component_*>,_std::allocator<Component_*>_> *
                           )in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
        local_368 = (_Base_ptr)pVar6.first._M_node;
        local_360 = pVar6.second;
        local_358 = local_368;
        local_350 = local_360;
        if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          poVar2 = std::operator<<(local_228,"  ");
          Component::QuotedName_abi_cxx11_(in_stack_fffffffffffffc18);
          poVar2 = std::operator<<(poVar2,local_388);
          in_stack_fffffffffffffb88 = (Configuration *)std::operator<<(poVar2," -> ");
          Component::QuotedName_abi_cxx11_(in_stack_fffffffffffffc18);
          in_stack_fffffffffffffb80 =
               (Component *)std::operator<<((ostream *)in_stack_fffffffffffffb88,local_3a8);
          in_stack_fffffffffffffb78 =
               (Component *)std::operator<<((ostream *)in_stack_fffffffffffffb80," [color=");
          psVar5 = getLinkColor_abi_cxx11_
                             (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                              in_stack_fffffffffffffb78);
          poVar2 = std::operator<<((ostream *)in_stack_fffffffffffffb78,(string *)psVar5);
          in_stack_fffffffffffffb60 = std::operator<<(poVar2,"];");
          std::operator<<(in_stack_fffffffffffffb60,'\n');
          std::__cxx11::string::~string(local_3a8);
          std::__cxx11::string::~string(local_388);
        }
      }
      std::__detail::_Node_iterator<Component_*,_true,_false>::operator++
                ((_Node_iterator<Component_*,_true,_false> *)in_stack_fffffffffffffb60);
    }
    std::set<Component_*,_std::less<Component_*>,_std::allocator<Component_*>_>::~set
              ((set<Component_*,_std::less<Component_*>,_std::allocator<Component_*>_> *)0x1a313c);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_false,_true>
                  *)in_stack_fffffffffffffb60);
  }
  poVar2 = std::operator<<(local_228,"}");
  std::operator<<(poVar2,'\n');
  OstreamHolder::~OstreamHolder((OstreamHolder *)0x1a3194);
  return;
}

Assistant:

void OutputFlatDependencies(const Configuration& config, std::unordered_map<std::string, Component *> &components, const filesystem::path &outfile) {
    OstreamHolder outHolder(outfile);
    std::ostream& out = outHolder.get();
    out << "digraph dependencies {" << '\n';
    for (const auto &c : components) {
        if (c.second->root.string().size() > 2 &&
            c.second->files.size()) {
            out << "  " << c.second->QuotedName() << " [shape=" << getShapeForSize(c.second) << "];\n";
        }

        std::set<Component *> depcomps;
        for (auto &d : c.second->privDeps) {
            if (d->root.string().size() > 2 &&
                d->files.size()) {
                if (depcomps.insert(d).second) {
                    out << "  " << c.second->QuotedName() << " -> " << d->QuotedName() << " [color="
                        << getLinkColor(config, c.second, d) << "];" << '\n';
                }
            }
        }
        for (auto &d : c.second->pubDeps) {
            if (d->root.string().size() > 2 &&
                d->files.size()) {
                if (depcomps.insert(d).second) {
                    out << "  " << c.second->QuotedName() << " -> " << d->QuotedName() << " [color="
                        << getLinkColor(config, c.second, d) << "];" << '\n';
                }
            }
        }
    }
    out << "}" << '\n';
}